

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O1

string * __thiscall Component::QuotedName_abi_cxx11_(string *__return_storage_ptr__,Component *this)

{
  ulong *puVar1;
  size_type *psVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  string local_60;
  ulong *local_40;
  long local_38;
  ulong local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"\"","");
  NiceName_abi_cxx11_(&local_60,this,'.');
  uVar5 = 0xf;
  if (local_40 != local_30) {
    uVar5 = local_30[0];
  }
  if (uVar5 < local_60._M_string_length + local_38) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      uVar4 = local_60.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar4 < local_60._M_string_length + local_38) goto LAB_00123730;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_40);
  }
  else {
LAB_00123730:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_60._M_dataplus._M_p);
  }
  local_a0 = &local_90;
  puVar1 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar1) {
    local_90 = *puVar1;
    uStack_88 = *(undefined4 *)(puVar3 + 3);
    uStack_84 = *(undefined4 *)((long)puVar3 + 0x1c);
  }
  else {
    local_90 = *puVar1;
    local_a0 = (ulong *)*puVar3;
  }
  local_98 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"\"","");
  uVar5 = 0xf;
  if (local_a0 != &local_90) {
    uVar5 = local_90;
  }
  if (uVar5 < (ulong)(local_78 + local_98)) {
    uVar5 = 0xf;
    if (local_80 != local_70) {
      uVar5 = local_70[0];
    }
    if ((ulong)(local_78 + local_98) <= uVar5) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_a0);
      goto LAB_00123818;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80);
LAB_00123818:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar2) {
    uVar4 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar2;
  puVar3[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Component::QuotedName() const {
    return std::string("\"") + NiceName('.') + std::string("\"");
}